

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O2

void lyext_load_plugins(void)

{
  int *piVar1;
  lyext_plugin *plVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  long lVar8;
  void *node;
  LY_ERR *pLVar9;
  undefined8 uVar10;
  lyext_plugin_list *plVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  undefined8 *puVar17;
  char *__name;
  ulong uVar18;
  undefined1 auStack_16b [11];
  char name [255];
  char *local_38;
  char *str;
  
  pcVar5 = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
  __name = "/usr/local/lib/libyang";
  if (pcVar5 != (char *)0x0) {
    __name = pcVar5;
  }
  __dirp = opendir(__name);
  if (__dirp == (DIR *)0x0) {
    if ('\0' < ly_log_level) {
      ly_log(LY_LLWRN,"libyang extensions plugins directory \"%s\" does not exist.",__name);
      return;
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ext_lock);
LAB_0015e479:
    while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
      if (pdVar6->d_type != '\n') {
        pcVar5 = pdVar6->d_name;
        sVar7 = strlen(pcVar5);
        if ((3 < sVar7) && (iVar4 = strcmp(pcVar5 + (sVar7 - 3),".so"), iVar4 == 0)) {
          memcpy(auStack_16b + 3,pcVar5,sVar7 - 3);
          auStack_16b[sVar7] = 0;
          asprintf(&local_38,"%s/%s",__name);
          lVar8 = dlopen(local_38,6);
          dlerror();
          if (lVar8 == 0) {
            node = (void *)dlopen(local_38,2);
            if (node == (void *)0x0) {
              pLVar9 = ly_errno_location();
              pcVar5 = local_38;
              *pLVar9 = LY_ESYS;
              uVar10 = dlerror();
              ly_log(LY_LLERR,"Loading \"%s\" as an extension plugin failed (%s).",pcVar5,uVar10);
              free(local_38);
            }
            else {
              if ('\x01' < ly_log_level) {
                ly_log(LY_LLVRB,"Extension plugin \"%s\" successfully loaded.",local_38);
              }
              free(local_38);
              dlerror();
              lVar8 = dlsym();
              local_38 = (char *)dlerror();
              uVar3 = ext_plugins_count;
              plVar11 = ext_plugins;
              if (local_38 == (char *)0x0) {
                uVar18 = (ulong)ext_plugins_count;
                uVar15 = 0;
                while( true ) {
                  pcVar5 = *(char **)(lVar8 + 0x10 + uVar15 * 0x20);
                  if (pcVar5 == (char *)0x0) break;
                  puVar17 = (undefined8 *)(uVar15 * 0x20 + lVar8);
                  unique0x1000067a = uVar15;
                  for (lVar13 = 0; uVar18 << 5 != lVar13; lVar13 = lVar13 + 0x20) {
                    iVar4 = strcmp(pcVar5,*(char **)((long)&plVar11->name + lVar13));
                    if (((iVar4 == 0) &&
                        (iVar4 = strcmp((char *)*puVar17,*(char **)((long)&plVar11->module + lVar13)
                                       ), iVar4 == 0)) &&
                       (((char *)puVar17[1] == (char *)0x0 ||
                        ((pcVar16 = *(char **)((long)&plVar11->revision + lVar13),
                         pcVar16 == (char *)0x0 ||
                         (iVar4 = strcmp((char *)puVar17[1],pcVar16), iVar4 == 0)))))) {
                      pLVar9 = ly_errno_location();
                      *pLVar9 = LY_ESYS;
                      pcVar5 = (char *)puVar17[1];
                      pcVar16 = "@";
                      if (pcVar5 == (char *)0x0) {
                        pcVar16 = "";
                        pcVar5 = "";
                      }
                      ly_log(LY_LLERR,
                             "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                             ,auStack_16b + 3,puVar17[2],*puVar17,pcVar16,pcVar5);
                      goto LAB_0015e865;
                    }
                  }
                  piVar1 = (int *)puVar17[3];
                  if ((*piVar1 == 1) && (lVar13 = *(long *)(piVar1 + 8), lVar13 != 0)) {
                    uVar12 = 0;
LAB_0015e6d6:
                    lVar14 = (ulong)uVar12 * 0x18;
                    iVar4 = *(int *)(lVar13 + lVar14);
                    if (iVar4 != 0) {
                      if (((iVar4 < 0x38) && (iVar4 != 0x16)) && (iVar4 != 0x13))
                      goto code_r0x0015e6fe;
                      pLVar9 = ly_errno_location();
                      *pLVar9 = LY_EINVAL;
                      uVar10 = puVar17[2];
                      pcVar5 = ly_stmt_str[*(int *)(*(long *)(piVar1 + 8) + lVar14)];
                      pcVar16 = 
                      "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
                      ;
                      goto LAB_0015e857;
                    }
                  }
                  uVar15 = (ulong)((int)stack0xffffffffffffff98 + 1);
                }
                plVar11 = (lyext_plugin_list *)realloc(plVar11,(ulong)((int)uVar15 + uVar3) << 5);
                if (plVar11 == (lyext_plugin_list *)0x0) {
                  pLVar9 = ly_errno_location();
                  *pLVar9 = LY_EMEM;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyext_load_plugins");
                  dlclose(node);
                  break;
                }
                ext_plugins = plVar11;
                for (lVar13 = uVar15 << 5; lVar13 != 0; lVar13 = lVar13 + -0x20) {
                  puVar17 = (undefined8 *)(lVar8 + -0x20 + lVar13);
                  pcVar5 = (char *)*puVar17;
                  pcVar16 = (char *)puVar17[1];
                  puVar17 = (undefined8 *)(lVar8 + -0x10 + lVar13);
                  plVar2 = (lyext_plugin *)puVar17[1];
                  plVar11[ext_plugins_count].name = (char *)*puVar17;
                  (&plVar11[ext_plugins_count].name)[1] = (char *)plVar2;
                  plVar11[ext_plugins_count].module = pcVar5;
                  plVar11[ext_plugins_count].revision = pcVar16;
                  ext_plugins_count = ext_plugins_count + 1;
                }
                ly_set_add(&dlhandlers,node,1);
              }
              else {
                pLVar9 = ly_errno_location();
                *pLVar9 = LY_ESYS;
                ly_log(LY_LLERR,
                       "Processing \"%s\" extension plugin failed, missing plugin list object (%s)."
                       ,auStack_16b + 3,local_38);
                dlclose(node);
              }
            }
          }
          else {
            if ('\x01' < ly_log_level) {
              ly_log(LY_LLVRB,"Extension plugin \"%s\" already loaded.",local_38);
            }
            free(local_38);
            dlclose(lVar8);
          }
        }
      }
    }
    closedir(__dirp);
    pthread_mutex_unlock((pthread_mutex_t *)&ext_lock);
  }
  return;
code_r0x0015e6fe:
  uVar12 = uVar12 + 1;
  if ((6 < iVar4 - 0x14U) || (*(uint *)(lVar13 + lVar14 + 0x10) < 2)) goto LAB_0015e6d6;
  pLVar9 = ly_errno_location();
  *pLVar9 = LY_EINVAL;
  uVar10 = puVar17[2];
  pcVar5 = ly_stmt_str[*(int *)(*(long *)(piVar1 + 8) + lVar14)];
  pcVar16 = 
  "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
  ;
LAB_0015e857:
  ly_log(LY_LLERR,pcVar16,auStack_16b + 3,uVar10,pcVar5);
LAB_0015e865:
  dlclose(node);
  goto LAB_0015e479;
}

Assistant:

API void
lyext_load_plugins(void)
{
    DIR* dir;
    struct dirent *file;
    size_t len;
    char *str;
    char name[NAME_MAX];
    void *dlhandler;
    struct lyext_plugin_list *plugin, *p;
    struct lyext_plugin_complex *pluginc;
    unsigned int u, v;
    const char *pluginsdir;

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LYEXT_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no plugins */
        LOGWRN("libyang extensions plugins directory \"%s\" does not exist.", pluginsdir);
        return;
    }

    /* lock the extension plugins list */
    pthread_mutex_lock(&ext_lock);

    while ((file = readdir(dir))) {
        if (file->d_type != DT_REG && file->d_type == DT_LNK) {
            /* other files than regular and symbolic links are ignored */
            continue;
        }

        /* required format of the filename is *LYEXT_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LYEXT_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LYEXT_PLUGIN_SUFFIX_LEN], LYEXT_PLUGIN_SUFFIX)) {
            continue;
        }

        /* store the name without the suffix */
        memcpy(name, file->d_name, len - LYEXT_PLUGIN_SUFFIX_LEN);
        name[len - LYEXT_PLUGIN_SUFFIX_LEN] = '\0';

        /* and construct the filepath */
        asprintf(&str, "%s/%s", pluginsdir, file->d_name);

        /* load the plugin - first, try if it is already loaded... */
        dlhandler = dlopen(str, RTLD_NOW | RTLD_NOLOAD);
        dlerror();    /* Clear any existing error */
        if (dlhandler) {
            /* the plugin is already loaded */
            LOGVRB("Extension plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }

        /* ... and if not, load it */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(LY_ESYS, "Loading \"%s\" as an extension plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        LOGVRB("Extension plugin \"%s\" successfully loaded.", str);
        free(str);
        dlerror();    /* Clear any existing error */

        /* get the plugin data */
        plugin = dlsym(dlhandler, name);
        str = dlerror();
        if (str) {
            LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed, missing plugin list object (%s).", name, str);
            dlclose(dlhandler);
            continue;
        }

        for(u = 0; plugin[u].name; u++) {
            /* check extension implementations for collisions */
            for (v = 0; v < ext_plugins_count; v++) {
                if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                        !strcmp(plugin[u].module, ext_plugins[v].module) &&
                        (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                    LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed,"
                           "implementation collision for extension %s from module %s%s%s.",
                           name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                           plugin[u].revision ? plugin[u].revision : "");
                    dlclose(dlhandler);
                    goto nextplugin;
                }
            }

            /* check for valid supported substatements in case of complex extension */
            if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
                pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
                for (v = 0; pluginc->substmt[v].stmt; v++) {
                    if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                            pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                            pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                        LOGERR(LY_EINVAL,
                               "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                    if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                             pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                             pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                        LOGERR(LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                               "substatement, which is not supported.",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                }
            }
        }


        /* add the new plugins, we have number of new plugins as u */
        p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
        if (!p) {
            LOGMEM;
            dlclose(dlhandler);
            closedir(dir);

            /* unlock the global structures */
            pthread_mutex_unlock(&ext_lock);

            return;
        }
        ext_plugins = p;
        for( ; u; u--) {
            memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
            ext_plugins_count++;
        }

        /* keep the handler */
        ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);

nextplugin:;
    }

    closedir(dir);

    /* unlock the global structures */
    pthread_mutex_unlock(&ext_lock);
}